

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O2

ZZ<136UL> * __thiscall GF2::ZZ<136UL>::operator-=(ZZ<136UL> *this,ZZ<136UL> *zRight)

{
  ulong uVar1;
  size_t pos;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    uVar4 = (this->super_WW<136UL>)._words[lVar2] - uVar1;
    (this->super_WW<136UL>)._words[lVar2] = uVar4;
    uVar3 = uVar4 - (zRight->super_WW<136UL>)._words[lVar2];
    (this->super_WW<136UL>)._words[lVar2] = uVar3;
    if (!CARRY8(uVar4,uVar1)) {
      uVar1 = (ulong)CARRY8(uVar3,(zRight->super_WW<136UL>)._words[lVar2]);
    }
  }
  (this->super_WW<136UL>)._words[2] = (ulong)(byte)(this->super_WW<136UL>)._words[2];
  return this;
}

Assistant:

ZZ& operator-=(const ZZ& zRight)
	{	
		word borrow = 0;
		for (size_t pos = 0; pos < _wcount; pos++)
			if ((_words[pos] -= borrow) > WORD_MAX - borrow) 
				_words[pos] -= zRight.GetWord(pos);
            else 
				borrow = (_words[pos] -= zRight.GetWord(pos)) > 
					WORD_MAX - zRight.GetWord(pos);
		Trim();
		return *this;
	}